

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_set_sync_write
          (t_rs_generator *this,string *set_var,bool set_var_is_ref,t_set *tset)

{
  t_type *ttype;
  ostream *poVar1;
  char *pcVar2;
  string local_150;
  string local_130;
  allocator local_109;
  string local_108;
  string local_e8;
  string local_c8;
  allocator local_a1;
  string local_a0 [8];
  string ref;
  string local_50;
  t_type *local_30;
  t_type *elem_type;
  t_set *tset_local;
  string *psStack_18;
  bool set_var_is_ref_local;
  string *set_var_local;
  t_rs_generator *this_local;
  
  elem_type = (t_type *)tset;
  tset_local._7_1_ = set_var_is_ref;
  psStack_18 = set_var;
  set_var_local = (string *)this;
  local_30 = t_set::get_elem_type(tset);
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"o_prot.write_set_begin(");
  poVar1 = std::operator<<(poVar1,"&TSetIdentifier::new(");
  to_rust_field_type_enum_abi_cxx11_((string *)((long)&ref.field_2 + 8),this,local_30);
  poVar1 = std::operator<<(poVar1,(string *)(ref.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)psStack_18);
  poVar1 = std::operator<<(poVar1,".len() as i32");
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::operator<<(poVar1,")?;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(ref.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = "&";
  if ((tset_local._7_1_ & 1) != 0) {
    pcVar2 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar2,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  t_generator::indent_abi_cxx11_(&local_c8,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_c8);
  poVar1 = std::operator<<(poVar1,"for e in ");
  poVar1 = std::operator<<(poVar1,local_a0);
  poVar1 = std::operator<<(poVar1,(string *)psStack_18);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c8);
  t_generator::indent_up(&this->super_t_generator);
  ttype = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"e",&local_109);
  string_container_write_variable(&local_e8,this,ttype,&local_108);
  render_type_sync_write(this,&local_e8,true,local_30);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_130,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_130);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  t_generator::indent_abi_cxx11_(&local_150,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_150);
  poVar1 = std::operator<<(poVar1,"o_prot.write_set_end()?;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void t_rs_generator::render_set_sync_write(const string &set_var, bool set_var_is_ref, t_set *tset) {
  t_type* elem_type = tset->get_elem_type();

  f_gen_
    << indent()
    << "o_prot.write_set_begin("
    << "&TSetIdentifier::new("
    << to_rust_field_type_enum(elem_type) << ", "
    << set_var << ".len() as i32" << ")"
    << ")?;"
    << endl;

  string ref(set_var_is_ref ? "" : "&");
  f_gen_ << indent() << "for e in " << ref << set_var << " {" << endl;
  indent_up();
  render_type_sync_write(string_container_write_variable(elem_type, "e"), true, elem_type);
  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "o_prot.write_set_end()?;" << endl;
}